

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CTandCTOTReadCoder(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *__return_storage_ptr__,string *reference,string *sequence,
                    vector<int,_std::allocator<int>_> *qualityList,char char1,char char2,char char3)

{
  size_type sVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  byte local_f5;
  int local_f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  vector<int,_std::allocator<int>_> *local_a0;
  string codedReadQualities;
  string codedRead;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_a0 = qualityList;
  local_38 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&codedRead,"",(allocator *)&local_e0);
  std::__cxx11::string::string((string *)&codedReadQualities,"",(allocator *)&local_e0);
  local_f4 = 0;
  iVar7 = 0;
  while (uVar6 = (ulong)iVar7, uVar6 < sequence->_M_string_length - 2) {
    pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence);
    iVar3 = local_f4 + 1;
    iVar5 = iVar7;
    if (((*pcVar2 == char1) &&
        (pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 == char2)) &&
       (pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 != char1)) {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)reference);
      if ((*pcVar2 == char2) &&
         (pcVar2 = (char *)std::__cxx11::string::at((ulong)reference), *pcVar2 == char1)) {
        if (local_f4 == 0) {
          std::__cxx11::string::append((char *)&codedRead);
        }
        else {
          std::__cxx11::to_string(&local_58,local_f4);
          std::operator+(&local_e0,&local_58,"O");
          std::__cxx11::string::append((string *)&codedRead);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::to_string(&local_e0,local_f4);
          std::__cxx11::string::append((string *)&codedReadQualities);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        std::__cxx11::string::push_back((char)&codedReadQualities);
LAB_001839ec:
        iVar7 = iVar7 + 1;
        uVar6 = (ulong)iVar7;
        local_f4 = 0;
        iVar3 = local_f4;
LAB_001835f9:
        local_f4 = iVar3;
        sVar1 = sequence->_M_string_length;
        iVar5 = iVar7;
        iVar3 = local_f4;
        if (sVar1 - 3 <= uVar6) {
          iVar5 = iVar7 + 1;
          if (sVar1 - 2 == (long)iVar5) {
            pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence);
            if (*pcVar2 == char1) {
              pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence);
              if ((*pcVar2 != char2) ||
                 (pcVar2 = (char *)std::__cxx11::string::at((ulong)reference), *pcVar2 == char1))
              goto LAB_0018366d;
              pcVar2 = (char *)std::__cxx11::string::at((ulong)reference);
              if (*pcVar2 == char2) {
                pcVar2 = (char *)std::__cxx11::string::at((ulong)reference);
                if (*pcVar2 == char1) {
                  if (local_f4 == 0) {
                    std::__cxx11::string::append((char *)&codedRead);
                  }
                  else {
                    std::__cxx11::to_string(&local_58,local_f4);
                    std::operator+(&local_e0,&local_58,"O");
                    std::__cxx11::string::append((string *)&codedRead);
                    std::__cxx11::string::~string((string *)&local_e0);
                    std::__cxx11::string::~string((string *)&local_58);
                    std::__cxx11::to_string(&local_e0,local_f4);
                    std::__cxx11::string::append((string *)&codedReadQualities);
                    std::__cxx11::string::~string((string *)&local_e0);
                  }
                  local_f5 = 1;
                  std::__cxx11::string::push_back((char)&codedReadQualities);
                  iVar5 = iVar7 + 2;
                  iVar3 = -1;
                  goto LAB_00183789;
                }
LAB_00183c01:
                local_f5 = 1;
              }
              else {
LAB_00183bf6:
                local_f5 = 1;
              }
              break;
            }
LAB_0018366d:
            pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence);
            local_f5 = 1;
            if (*pcVar2 == char1) {
              pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence);
              if ((*pcVar2 == char3) &&
                 (pcVar2 = (char *)std::__cxx11::string::at((ulong)reference), *pcVar2 != char1)) {
                pcVar2 = (char *)std::__cxx11::string::at((ulong)reference);
                if (*pcVar2 != char2) goto LAB_00183bf6;
                pcVar2 = (char *)std::__cxx11::string::at((ulong)reference);
                if (*pcVar2 != char1) goto LAB_00183c01;
                if (local_f4 == 0) {
                  std::__cxx11::string::append((char *)&codedRead);
                }
                else {
                  std::__cxx11::to_string(&local_58,local_f4);
                  std::operator+(&local_e0,&local_58,"C");
                  std::__cxx11::string::append((string *)&codedRead);
                  std::__cxx11::string::~string((string *)&local_e0);
                  std::__cxx11::string::~string((string *)&local_58);
                  std::__cxx11::to_string(&local_e0,local_f4);
                  std::__cxx11::string::append((string *)&codedReadQualities);
                  std::__cxx11::string::~string((string *)&local_e0);
                }
                local_f5 = 1;
                std::__cxx11::string::push_back((char)&codedReadQualities);
                iVar5 = iVar7 + 2;
                iVar3 = -1;
              }
            }
          }
          else {
            local_f5 = local_f5 & sVar1 - 1 != (long)iVar5;
          }
        }
      }
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence);
      if (((*pcVar2 != char1) ||
          (pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 != char3)) ||
         (pcVar2 = (char *)std::__cxx11::string::at((ulong)sequence), *pcVar2 == char1))
      goto LAB_001835f9;
      pcVar2 = (char *)std::__cxx11::string::at((ulong)reference);
      if ((*pcVar2 == char2) &&
         (pcVar2 = (char *)std::__cxx11::string::at((ulong)reference), *pcVar2 == char1)) {
        if (local_f4 == 0) {
          std::__cxx11::string::append((char *)&codedRead);
        }
        else {
          std::__cxx11::to_string(&local_58,local_f4);
          std::operator+(&local_e0,&local_58,"C");
          std::__cxx11::string::append((string *)&codedRead);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::to_string(&local_e0,local_f4);
          std::__cxx11::string::append((string *)&codedReadQualities);
          std::__cxx11::string::~string((string *)&local_e0);
        }
        std::__cxx11::string::push_back((char)&codedReadQualities);
        goto LAB_001839ec;
      }
    }
LAB_00183789:
    local_f4 = iVar3;
    iVar7 = iVar5 + 1;
  }
  if (local_f4 - 1U < 0xfffffffe) {
    std::__cxx11::to_string(&local_e0,local_f4 + 2);
    std::__cxx11::string::append((string *)&codedRead);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::to_string(&local_e0,local_f4 + 2);
    std::__cxx11::string::append((string *)&codedReadQualities);
  }
  else {
    if (local_f4 == -1) goto LAB_00183b6d;
    if ((local_f5 & 1) == 0) {
      std::__cxx11::to_string(&local_e0,local_f4 + 1);
      std::__cxx11::string::append((string *)&codedRead);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::to_string(&local_e0,local_f4 + 1);
      std::__cxx11::string::append((string *)&codedReadQualities);
    }
    else {
      std::__cxx11::to_string(&local_e0,local_f4 + 2);
      std::__cxx11::string::append((string *)&codedRead);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::to_string(&local_e0,local_f4 + 2);
      std::__cxx11::string::append((string *)&codedReadQualities);
    }
  }
  std::__cxx11::string::~string((string *)&local_e0);
LAB_00183b6d:
  std::__cxx11::string::string((string *)&local_e0,(string *)&codedRead);
  std::__cxx11::string::string(local_c0,(string *)&codedReadQualities);
  __l._M_len = 2;
  __l._M_array = &local_e0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_38,__l,(allocator_type *)&local_58);
  lVar4 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_e0._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&codedReadQualities);
  std::__cxx11::string::~string((string *)&codedRead);
  return local_38;
}

Assistant:

std::vector<string> CTandCTOTReadCoder(string reference,string sequence,vector<int> qualityList,char char1,char char2,char char3){

    string codedRead = "";
    string codedReadQualities = "";
    bool endChecker;
    int counter = 0;

    for(int i =0; i<sequence.size()-2 ; i++){
        counter ++;
        if((sequence.at(i)==char1) && (sequence.at(i+1)==char2) && (sequence.at(i+2)!=char1)){
            if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                continue;
            }

            if(counter == 1){
                codedRead += "O";
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }else{
                codedRead += std::to_string(counter-1) + "O";
                codedReadQualities += std::to_string(counter-1);
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }
            i += 1;
            counter = 0;
        }else if((sequence.at(i)==char1) && (sequence.at(i+1)==char3) && (sequence.at(i+2)!=char1)){
            if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                continue;
            }
            if(counter == 1){
                codedRead += "C";
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }else{
                codedRead += std::to_string(counter-1) + "C";
                codedReadQualities += std::to_string(counter-1);
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }

            i += 1;
            counter = 0;
        }
        //This portion is specifically for calculating the last three nucleotides in the read sequence
        if(i>=sequence.size()-3){
            i++;
            if(i==sequence.size()-2){
                endChecker = true;
                if((sequence.at(i)==char1) && (sequence.at(i+1)==char2) && (reference.at(i+2)!=char1)){
                    counter++;
                    if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                        counter-=1;
                        break;
                    }
                    if(counter == 1){
                        codedRead += "O";
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }else{
                        codedRead += std::to_string(counter-1) + "O";
                        codedReadQualities += std::to_string(counter-1);
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }
                    i += 1;
                    counter = -1;

                }else if((sequence.at(i)==char1) && (sequence.at(i+1)==char3) && (reference.at(i+2)!=char1)){
                    counter++;
                    if(reference.at(i+1)!=char2|| reference.at(i)!=char1){
                        counter-=1;
                        break;
                    }
                    if(counter == 1){
                        codedRead += "C";
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }else{
                        codedRead += std::to_string(counter-1) + "C";
                        codedReadQualities += std::to_string(counter-1);
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }

                    i += 1;
                    counter = -1;
                }

            }else if(i==sequence.size()-1){
                endChecker = false;
            }
        }

    }
    if(counter!=0 && counter!=-1){
        codedRead += std::to_string(counter+2);
        codedReadQualities += std::to_string(counter+2);
    }else if(counter!=-1){
        if(endChecker){
            codedRead += std::to_string(counter+2);
            codedReadQualities += std::to_string(counter+2);
        }else{
            codedRead += std::to_string(counter+1);
            codedReadQualities += std::to_string(counter+1);
        }
    }

    return {codedRead,codedReadQualities};

}